

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::EnumClass>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
::destroy_slots(raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::EnumClass>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
                *this)

{
  allocator_type *alloc;
  size_t n;
  ctrl_t *pcVar1;
  size_t *psVar2;
  undefined1 local_20 [8];
  Layout layout;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::EnumClass>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
  *this_local;
  
  if (this->capacity_ != 0) {
    layout.super_LayoutType<sizeof___(Ts),_signed_char,_phmap::priv::hash_internal::EnumClass>.size_
    [1] = (size_t)this;
    _local_20 = (size_t  [2])MakeLayout(this->capacity_);
    SanitizerUnpoisonMemoryRegion(this->slots_,this->capacity_ << 3);
    alloc = alloc_ref(this);
    pcVar1 = this->ctrl_;
    n = internal_layout::
        LayoutImpl<std::tuple<signed_char,_phmap::priv::hash_internal::EnumClass>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL>_>
        ::AllocSize((LayoutImpl<std::tuple<signed_char,_phmap::priv::hash_internal::EnumClass>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL>_>
                     *)local_20);
    Deallocate<8ul,phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>>(alloc,pcVar1,n);
    pcVar1 = EmptyGroup<std::is_same<phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>,std::allocator<phmap::priv::hash_internal::EnumClass>>>
                       ();
    this->ctrl_ = pcVar1;
    this->slots_ = (slot_type *)0x0;
    this->size_ = 0;
    this->capacity_ = 0;
    psVar2 = growth_left(this);
    *psVar2 = 0;
  }
  return;
}

Assistant:

void destroy_slots() {
        if (!capacity_)
            return;
        
        PHMAP_IF_CONSTEXPR((!std::is_trivially_destructible<typename PolicyTraits::value_type>::value ||
                            std::is_same<typename Policy::is_flat, std::false_type>::value)) {
            // node map, or not trivially destructible... we  need to iterate and destroy values one by one
            // std::cout << "either this is a node map or " << type_name<typename PolicyTraits::value_type>()  << " is not trivially_destructible\n";
            for (size_t i = 0, cnt = capacity_; i != cnt; ++i) {
                if (IsFull(ctrl_[i])) {
                    PolicyTraits::destroy(&alloc_ref(), slots_ + i);
                }
            }
        } 
        auto layout = MakeLayout(capacity_);
        // Unpoison before returning the memory to the allocator.
        SanitizerUnpoisonMemoryRegion(slots_, sizeof(slot_type) * capacity_);
        Deallocate<Layout::Alignment()>(&alloc_ref(), ctrl_, layout.AllocSize());
        ctrl_ = EmptyGroup<std_alloc_t>();
        slots_ = nullptr;
        size_ = 0;
        capacity_ = 0;
        growth_left() = 0;
    }